

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QMakeParser::BlockScope>::relocate
          (QArrayDataPointer<QMakeParser::BlockScope> *this,qsizetype offset,BlockScope **data)

{
  BlockScope *d_first;
  BlockScope *pBVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<QMakeParser::BlockScope,long_long>(this->ptr,this->size,d_first);
  if (data != (BlockScope **)0x0) {
    pBVar1 = *data;
    if ((this->ptr <= pBVar1) && (pBVar1 < this->ptr + this->size)) {
      *data = pBVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }